

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O1

void __thiscall
Fossilize::DumbDirectoryDatabase::DumbDirectoryDatabase
          (DumbDirectoryDatabase *this,string *base,DatabaseMode mode_)

{
  pointer pcVar1;
  __node_base_ptr *pp_Var2;
  long lVar3;
  
  DatabaseInterface::DatabaseInterface(&this->super_DatabaseInterface,mode_);
  (this->super_DatabaseInterface)._vptr_DatabaseInterface =
       (_func_int **)&PTR__DumbDirectoryDatabase_003a86f0;
  (this->base_directory)._M_dataplus._M_p = (pointer)&(this->base_directory).field_2;
  pcVar1 = (base->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->base_directory,pcVar1,pcVar1 + base->_M_string_length);
  this->mode = mode_;
  pp_Var2 = &this->seen_blobs[0]._M_h._M_single_bucket;
  lVar3 = 0x230;
  do {
    ((_Hashtable *)(pp_Var2 + -6))->_M_buckets = pp_Var2;
    pp_Var2[-5] = (__node_base_ptr)0x1;
    ((__node_base *)(pp_Var2 + -4))->_M_nxt = (_Hash_node_base *)0x0;
    pp_Var2[-3] = (__node_base_ptr)0x0;
    ((_Prime_rehash_policy *)(pp_Var2 + -2))->_M_max_load_factor = 1.0;
    pp_Var2[-1] = (__node_base_ptr)0x0;
    *pp_Var2 = (__node_base_ptr)0x0;
    pp_Var2 = pp_Var2 + 7;
    lVar3 = lVar3 + -0x38;
  } while (lVar3 != 0);
  if (this->mode == ExclusiveOverWrite) {
    this->mode = OverWrite;
  }
  return;
}

Assistant:

DumbDirectoryDatabase(const string &base, DatabaseMode mode_)
		: DatabaseInterface(mode_), base_directory(base), mode(mode_)
	{
		if (mode == DatabaseMode::ExclusiveOverWrite)
			mode = DatabaseMode::OverWrite;
	}